

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_file_exists(char *filename,wchar_t line,char *f)

{
  int iVar1;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = access(in_RDX,0);
  if (iVar1 != 0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File should exist: %s",in_RDX);
    failure_finish((void *)0x105f00);
  }
  local_4 = (wchar_t)(iVar1 == 0);
  return local_4;
}

Assistant:

int
assertion_file_exists(const char *filename, int line, const char *f)
{
	assertion_count(filename, line);

#if defined(_WIN32) && !defined(__CYGWIN__)
	if (!_access(f, 0))
		return (1);
#else
	if (!access(f, F_OK))
		return (1);
#endif
	failure_start(filename, line, "File should exist: %s", f);
	failure_finish(NULL);
	return (0);
}